

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O3

void * Proof_DeriveCore(Vec_Set_t *vProof,int hRoot)

{
  Vec_Int_t *vUsed;
  Vec_Int_t *pVVar1;
  int in_EDX;
  Vec_Int_t Roots;
  int local_24;
  Vec_Int_t local_20;
  
  local_20.pArray = &local_24;
  local_20.nCap = 1;
  local_20.nSize = 1;
  if (hRoot == -1) {
    pVVar1 = (Vec_Int_t *)0x0;
  }
  else {
    local_24 = hRoot;
    vUsed = Proof_CollectUsedIter(vProof,&local_20,in_EDX);
    pVVar1 = Sat_ProofCollectCore(vProof,vUsed);
    if (vUsed->pArray != (int *)0x0) {
      free(vUsed->pArray);
    }
    free(vUsed);
    qsort(pVVar1->pArray,(long)pVVar1->nSize,4,Vec_IntSortCompare2);
  }
  return pVVar1;
}

Assistant:

void * Proof_DeriveCore( Vec_Set_t * vProof, int hRoot )
{
    Vec_Int_t Roots = { 1, 1, &hRoot }, * vRoots = &Roots;
    Vec_Int_t * vCore, * vUsed;
    if ( hRoot == -1 )
        return NULL;
    // collect visited clauses
    vUsed = Proof_CollectUsedIter( vProof, vRoots, 0 );
    // collect core clauses 
    vCore = Sat_ProofCollectCore( vProof, vUsed );
    Vec_IntFree( vUsed );
    Vec_IntSort( vCore, 1 );
    return vCore;
}